

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_xar.c
# Opt level: O0

void test_write_format_xar(void)

{
  char *in_stack_00000090;
  
  test_xar(in_stack_00000090);
  test_xar(in_stack_00000090);
  test_xar(in_stack_00000090);
  test_xar(in_stack_00000090);
  test_xar(in_stack_00000090);
  test_xar(in_stack_00000090);
  test_xar(in_stack_00000090);
  test_xar(in_stack_00000090);
  test_xar(in_stack_00000090);
  test_xar(in_stack_00000090);
  test_xar(in_stack_00000090);
  test_xar(in_stack_00000090);
  test_xar(in_stack_00000090);
  test_xar(in_stack_00000090);
  test_xar(in_stack_00000090);
  test_xar(in_stack_00000090);
  test_xar(in_stack_00000090);
  test_xar(in_stack_00000090);
  test_xar(in_stack_00000090);
  test_xar(in_stack_00000090);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_xar)
{
	/* Default mode. */
	test_xar(NULL);

	/* Disable TOC checksum. */
	test_xar("!toc-checksum");
	/* Specify TOC checksum type to sha1. */
	test_xar("toc-checksum=sha1");
	/* Specify TOC checksum type to md5. */
	test_xar("toc-checksum=md5");

	/* Disable file checksum. */
	test_xar("!checksum");
	/* Specify file checksum type to sha1. */
	test_xar("checksum=sha1");
	/* Specify file checksum type to md5. */
	test_xar("checksum=md5");

	/* Disable compression. */
	test_xar("!compression");
	/* Specify compression type to gzip. */
	test_xar("compression=gzip");
	test_xar("compression=gzip,compression-level=1");
	test_xar("compression=gzip,compression-level=9");
	/* Specify compression type to bzip2. */
	test_xar("compression=bzip2");
	test_xar("compression=bzip2,compression-level=1");
	test_xar("compression=bzip2,compression-level=9");
	/* Specify compression type to lzma. */
	test_xar("compression=lzma");
	test_xar("compression=lzma,compression-level=1");
	test_xar("compression=lzma,compression-level=9");
	/* Specify compression type to xz. */
	test_xar("compression=xz");
	test_xar("compression=xz,compression-level=1");
	test_xar("compression=xz,compression-level=9");
}